

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.cpp
# Opt level: O1

bool AppInitBasicSetup(ArgsManager *args,atomic<int> *exit_status)

{
  bool bVar1;
  long in_FS_OFFSET;
  long *local_e0;
  long local_d8;
  long local_d0 [2];
  _union_1457 local_c0;
  undefined1 local_b8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90 [5];
  undefined4 local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = SetupNetworking();
  if (bVar1) {
    local_c0.sa_handler = HandleSIGTERM;
    sigemptyset((sigset_t *)local_b8);
    local_38 = 0;
    sigaction(0xf,(sigaction *)&local_c0,(sigaction *)0x0);
    local_c0.sa_handler = HandleSIGTERM;
    sigemptyset((sigset_t *)local_b8);
    local_38 = 0;
    sigaction(2,(sigaction *)&local_c0,(sigaction *)0x0);
    local_c0.sa_handler = HandleSIGHUP;
    sigemptyset((sigset_t *)local_b8);
    local_38 = 0;
    sigaction(1,(sigaction *)&local_c0,(sigaction *)0x0);
    signal(0xd,(__sighandler_t)0x1);
    std::set_new_handler(new_handler_terminate);
    bVar1 = true;
  }
  else {
    local_e0 = local_d0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e0,"Initializing networking failed.","");
    local_c0.sa_handler = (__sighandler_t)(local_b8 + 8);
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c0,local_e0,local_d8 + (long)local_e0);
    local_a0 = local_90;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a0,local_e0,local_d8 + (long)local_e0);
    bVar1 = InitError((bilingual_str *)&local_c0);
    if (local_a0 != local_90) {
      operator_delete(local_a0,local_90[0]._M_allocated_capacity + 1);
    }
    if (local_c0.sa_handler != (__sighandler_t)(local_b8 + 8)) {
      operator_delete(local_c0.sa_handler,local_b8._8_8_ + 1);
    }
    if (local_e0 != local_d0) {
      operator_delete(local_e0,local_d0[0] + 1);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool AppInitBasicSetup(const ArgsManager& args, std::atomic<int>& exit_status)
{
    // ********************************************************* Step 1: setup
#ifdef _MSC_VER
    // Turn off Microsoft heap dump noise
    _CrtSetReportMode(_CRT_WARN, _CRTDBG_MODE_FILE);
    _CrtSetReportFile(_CRT_WARN, CreateFileA("NUL", GENERIC_WRITE, 0, nullptr, OPEN_EXISTING, 0, 0));
    // Disable confusing "helpful" text message on abort, Ctrl-C
    _set_abort_behavior(0, _WRITE_ABORT_MSG | _CALL_REPORTFAULT);
#endif
#ifdef WIN32
    // Enable heap terminate-on-corruption
    HeapSetInformation(nullptr, HeapEnableTerminationOnCorruption, nullptr, 0);
#endif
    if (!SetupNetworking()) {
        return InitError(Untranslated("Initializing networking failed."));
    }

#ifndef WIN32
    // Clean shutdown on SIGTERM
    registerSignalHandler(SIGTERM, HandleSIGTERM);
    registerSignalHandler(SIGINT, HandleSIGTERM);

    // Reopen debug.log on SIGHUP
    registerSignalHandler(SIGHUP, HandleSIGHUP);

    // Ignore SIGPIPE, otherwise it will bring the daemon down if the client closes unexpectedly
    signal(SIGPIPE, SIG_IGN);
#else
    SetConsoleCtrlHandler(consoleCtrlHandler, true);
#endif

    std::set_new_handler(new_handler_terminate);

    return true;
}